

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<sophiaevent_output,_std::shared_ptr<sophiaevent_output>_> * __thiscall
pybind11::class_<sophiaevent_output,std::shared_ptr<sophiaevent_output>>::
def<int(sophiaevent_output::*)(int)const>
          (class_<sophiaevent_output,std::shared_ptr<sophiaevent_output>> *this,char *name_,
          offset_in_sophiaevent_output_to_subr *f)

{
  offset_in_sophiaevent_output_to_subr f_00;
  name *extra;
  char *local_60 [4];
  object local_40;
  object local_38;
  cpp_function local_30;
  cpp_function cf;
  
  f_00 = *f;
  extra = (name *)f[1];
  cf.super_function.super_object.super_handle.m_ptr = *(function *)this;
  local_40.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_60[0] = name_;
  getattr((pybind11 *)&local_38,(handle)cf.super_function.super_object.super_handle.m_ptr,name_,
          (PyObject *)&_Py_NoneStruct);
  cpp_function::
  cpp_function<int,sophiaevent_output,int,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_30,f_00,extra,(is_method *)local_60,(sibling *)&cf);
  object::~object(&local_38);
  object::~object(&local_40);
  cpp_function::name(&cf);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_60,(object_api<pybind11::handle> *)this,
             (handle)cf.super_function.super_object.super_handle.m_ptr);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_60,&local_30);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_60);
  object::~object((object *)&cf);
  object::~object((object *)&local_30);
  return (class_<sophiaevent_output,_std::shared_ptr<sophiaevent_output>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }